

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O3

int * __thiscall
TTD::UnorderedArrayList<int,_32UL>::NextOpenEntry(UnorderedArrayList<int,_32UL> *this)

{
  int *piVar1;
  int *piVar2;
  
  piVar2 = (this->m_inlineHeadBlock).CurrPos;
  piVar1 = (this->m_inlineHeadBlock).EndPos;
  if ((piVar2 <= piVar1) &&
     ((ulong)((long)piVar2 - (long)(this->m_inlineHeadBlock).BlockData) < 0x84)) {
    if (piVar2 == piVar1) {
      AddArrayLink(this);
      piVar2 = (this->m_inlineHeadBlock).CurrPos;
    }
    (this->m_inlineHeadBlock).CurrPos = piVar2 + 1;
    return piVar2;
  }
  TTDAbort_unrecoverable_error("We are off the end of the array");
}

Assistant:

T* NextOpenEntry()
        {
            TTDAssert(this->m_inlineHeadBlock.CurrPos <= this->m_inlineHeadBlock.EndPos, "We are off the end of the array");
            TTDAssert((((byte*)this->m_inlineHeadBlock.CurrPos) - ((byte*)this->m_inlineHeadBlock.BlockData)) / sizeof(T) <= allocSize, "We are off the end of the array");

            if (this->m_inlineHeadBlock.CurrPos == this->m_inlineHeadBlock.EndPos)
            {
                this->AddArrayLink();
            }

            T* entry = this->m_inlineHeadBlock.CurrPos;
            this->m_inlineHeadBlock.CurrPos++;

            return entry;
        }